

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void JSON::writeClose(Pipeline *p,bool first,size_t depth,char *delimiter)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string s;
  char *delimiter_local;
  size_t depth_local;
  bool first_local;
  Pipeline *p_local;
  
  s.field_2._8_8_ = delimiter;
  if (first) {
    Pipeline::operator<<(p,delimiter);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"\n",&local_49);
    std::allocator<char>::~allocator(&local_49);
    std::__cxx11::string::append((ulong)local_48,(char)depth * '\x02');
    std::operator+(&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   (char *)s.field_2._8_8_);
    Pipeline::operator<<(p,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void
JSON::writeClose(Pipeline* p, bool first, size_t depth, char const* delimiter)
{
    if (first) {
        *p << delimiter;
    } else {
        std::string s{"\n"};
        s.append(2 * depth, ' ');
        *p << s + delimiter;
    }
}